

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void rile_shk(monst *shkp)

{
  short sVar1;
  long lVar2;
  undefined1 auVar3 [16];
  int *piVar4;
  uint uVar5;
  
  shkp->field_0x62 = shkp->field_0x62 & 0xbf;
  if (*(char *)((long)&shkp[0x1b].meating + 2) == '\0') {
    lVar2 = *(long *)&shkp[0x1b].mnum;
    sVar1 = *(short *)((long)&shkp[0x1b].misc_worn_check + 2);
    *(undefined1 *)((long)&shkp[0x1b].meating + 2) = 1;
    if (0 < sVar1) {
      piVar4 = (int *)(lVar2 + 8);
      uVar5 = (int)sVar1 + 1;
      do {
        auVar3 = SEXT816((long)*piVar4 + 2) * SEXT816(0x5555555555555556);
        *piVar4 = (auVar3._8_4_ + *piVar4) - (auVar3._12_4_ >> 0x1f);
        piVar4 = piVar4 + 4;
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
  }
  return;
}

Assistant:

static void rile_shk(struct monst *shkp)
{
	NOTANGRY(shkp) = FALSE;	/* make angry */
	if (!ESHK(shkp)->surcharge) {
		struct bill_x *bp = ESHK(shkp)->bill_p;
		int ct = ESHK(shkp)->billct;

		ESHK(shkp)->surcharge = TRUE;
		while (ct-- > 0) {
			long surcharge = (bp->price + 2L) / 3L;
			bp->price += surcharge;
			bp++;
		}
	}
}